

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkImplementationLibraries * __thiscall
cmGeneratorTarget::GetLinkImplementationLibrariesInternal
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head,LinkInterfaceFor implFor)

{
  bool bVar1;
  pointer ppVar2;
  byte local_61;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *local_60;
  cmOptionalLinkImplementation *impl;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
  local_40;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *local_38;
  HeadToLinkImplementationMap *hm;
  cmGeneratorTarget *pcStack_28;
  LinkInterfaceFor implFor_local;
  cmGeneratorTarget *head_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  hm._4_4_ = implFor;
  pcStack_28 = head;
  head_local = (cmGeneratorTarget *)config;
  config_local = (string *)this;
  bVar1 = CanCompileSources(this);
  if (bVar1) {
    if (hm._4_4_ == Usage) {
      local_60 = &GetHeadToLinkImplementationUsageRequirementsMap(this,(string *)head_local)->
                  super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    else {
      local_60 = &GetHeadToLinkImplementationMap(this,(string *)head_local)->
                  super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
      ;
    }
    local_38 = local_60;
    bVar1 = std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
            ::empty(local_60);
    local_61 = 0;
    if (!bVar1) {
      local_40._M_node =
           (_Base_ptr)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
           ::begin(local_38);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
               ::operator->(&local_40);
      local_61 = (ppVar2->second).super_cmLinkImplementation.field_0xa3 ^ 0xff;
    }
    if ((local_61 & 1) != 0) {
      impl = (cmOptionalLinkImplementation *)
             std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
             ::begin(local_38);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
                             *)&impl);
      pcStack_28 = ppVar2->first;
    }
    this_local = (cmGeneratorTarget *)
                 std::
                 map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
                 ::operator[](local_38,&stack0xffffffffffffffd8);
    if (((this_local->CompileDefinitionsCache)._M_t._M_impl.field_0x1 & 1) == 0) {
      (this_local->CompileDefinitionsCache)._M_t._M_impl.field_0x1 = 1;
      ComputeLinkImplementationLibraries
                (this,(string *)head_local,(cmOptionalLinkImplementation *)this_local,pcStack_28,
                 hm._4_4_);
    }
  }
  else {
    this_local = (cmGeneratorTarget *)0x0;
  }
  return (cmLinkImplementationLibraries *)this_local;
}

Assistant:

cmLinkImplementationLibraries const*
cmGeneratorTarget::GetLinkImplementationLibrariesInternal(
  const std::string& config, cmGeneratorTarget const* head,
  LinkInterfaceFor implFor) const
{
  // There is no link implementation for targets that cannot compile sources.
  if (!this->CanCompileSources()) {
    return nullptr;
  }

  // Populate the link implementation libraries for this configuration.
  HeadToLinkImplementationMap& hm =
    (implFor == LinkInterfaceFor::Usage
       ? this->GetHeadToLinkImplementationUsageRequirementsMap(config)
       : this->GetHeadToLinkImplementationMap(config));

  // If the link implementation does not depend on the head target
  // then reuse the one from the head we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    head = hm.begin()->first;
  }

  cmOptionalLinkImplementation& impl = hm[head];
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, head, implFor);
  }
  return &impl;
}